

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

bool __thiscall QDialogButtonBox::event(QDialogButtonBox *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QEvent *in_RSI;
  QDialogButtonBoxPrivate *d;
  QDialogButtonBoxPrivate *in_stack_00000040;
  QEvent *in_stack_00000128;
  QWidget *in_stack_00000130;
  undefined4 in_stack_ffffffffffffffe0;
  
  d_func((QDialogButtonBox *)0x66e970);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Show) {
    QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault(in_stack_00000040);
  }
  else if (TVar2 == LanguageChange) {
    QDialogButtonBoxPrivate::retranslateStrings
              ((QDialogButtonBoxPrivate *)CONCAT44(0x59,in_stack_ffffffffffffffe0));
  }
  bVar1 = QWidget::event(in_stack_00000130,in_stack_00000128);
  return bVar1;
}

Assistant:

bool QDialogButtonBox::event(QEvent *event)
{
    Q_D(QDialogButtonBox);
    switch (event->type()) {
    case QEvent::Show:
        d->ensureFirstAcceptIsDefault();
        break;

    case QEvent::LanguageChange:
        d->retranslateStrings();
        break;

    default: break;
    }

    return QWidget::event(event);
}